

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O2

FieldAlignmentGroups * __thiscall
google::protobuf::compiler::cpp::MessageLayoutHelper::BuildFieldAlignmentGroups
          (FieldAlignmentGroups *__return_storage_ptr__,MessageLayoutHelper *this,
          FieldVector *fields,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  pointer ppFVar1;
  FieldDescriptor *field;
  char *pcVar2;
  bool bVar3;
  FieldFamily FVar4;
  uint uVar5;
  int iVar6;
  LogMessage *pLVar7;
  FieldAlignmentGroups *pFVar8;
  pointer ppFVar9;
  ulong uVar10;
  string_view v;
  LogMessage local_78;
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  fast_path_fields;
  FieldGroup fg;
  
  memset(__return_storage_ptr__,0,0x870);
  BuildFastParseTable(&fast_path_fields,this,options,scc_analyzer);
  ppFVar9 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppFVar9 == ppFVar1) {
      std::
      _Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
      ::~_Vector_base(&fast_path_fields.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                     );
      return __return_storage_ptr__;
    }
    field = *ppFVar9;
    FVar4 = GetFieldFamily(field,options,scc_analyzer);
    bVar3 = ShouldSplit(field,options);
    if (bVar3) {
      uVar10 = 0;
    }
    else {
      bVar3 = FieldDescriptor::is_repeated(field);
      uVar10 = 5;
      if (!bVar3) {
        uVar5 = (*this->_vptr_MessageLayoutHelper[4])(this,field,options,scc_analyzer);
        uVar10 = 1;
        if (uVar5 != 1) {
          bVar3 = IsFastPathField(field,&fast_path_fields);
          uVar10 = (ulong)uVar5;
          if (bVar3) {
            uVar10 = 4;
          }
        }
      }
    }
    (*this->_vptr_MessageLayoutHelper[5])(&fg,this,field);
    iVar6 = EstimateAlignmentSize(field);
    pFVar8 = __return_storage_ptr__;
    if (((iVar6 != 1) &&
        (pFVar8 = (FieldAlignmentGroups *)&__return_storage_ptr__->aligned_to_4, iVar6 != 4)) &&
       (pFVar8 = (FieldAlignmentGroups *)&__return_storage_ptr__->aligned_to_8, iVar6 != 8)) break;
    std::
    vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
    ::push_back((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                 *)(&(pFVar8->aligned_to_1)._M_elems[FVar4].field_0x0 + uVar10 * 0x18),&fg);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&fg);
    ppFVar9 = ppFVar9 + 1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message_layout_helper.cc"
             ,0xa4);
  pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_78,(char (*) [24])"Unknown alignment size ");
  iVar6 = EstimateAlignmentSize(field);
  pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,iVar6);
  pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,(char (*) [11])0x110c459)
  ;
  pcVar2 = (field->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
  v._M_str = pcVar2 + ~v._M_len;
  pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,v);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,(char (*) [2])0x1096008);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

MessageLayoutHelper::FieldAlignmentGroups
MessageLayoutHelper::BuildFieldAlignmentGroups(
    const FieldVector& fields, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) const {
  FieldAlignmentGroups field_alignment_groups;
  const auto fast_path_fields = BuildFastParseTable(options, scc_analyzer);

  for (const auto* field : fields) {
    FieldFamily f = GetFieldFamily(field, options, scc_analyzer);

    FieldHotness hotness;
    if (ShouldSplit(field, options)) {
      hotness = kSplit;
    } else if (field->is_repeated()) {
      hotness = kRepeated;
    } else {
      hotness = GetFieldHotness(field, options, scc_analyzer);

      if (hotness != kCold && IsFastPathField(field, fast_path_fields)) {
        hotness = kFastParse;
      }
    }

    FieldGroup fg = SingleFieldGroup(field);
    switch (EstimateAlignmentSize(field)) {
      case 1:
        field_alignment_groups.aligned_to_1[f][hotness].push_back(fg);
        break;
      case 4:
        field_alignment_groups.aligned_to_4[f][hotness].push_back(fg);
        break;
      case 8:
        field_alignment_groups.aligned_to_8[f][hotness].push_back(fg);
        break;
      default:
        ABSL_LOG(FATAL) << "Unknown alignment size "
                        << EstimateAlignmentSize(field) << "for field "
                        << field->full_name() << ".";
    }
  }

  return field_alignment_groups;
}